

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O2

Pivot * __thiscall fizplex::Base::find_pivot(Pivot *__return_storage_ptr__,Base *this,size_t ind)

{
  double dVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar6 [16];
  undefined1 local_48 [16];
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  lVar4 = ind << 5;
  local_48 = ZEXT816(0);
  sVar3 = 0;
  bVar2 = false;
  sVar5 = ind;
  do {
    if (this->m <= sVar5) {
      __return_storage_ptr__->value = (double)local_48._0_8_;
      __return_storage_ptr__->index = sVar3;
      __return_storage_ptr__->found = bVar2;
      return __return_storage_ptr__;
    }
    dVar1 = SVector::get_value((SVector *)
                               ((long)&(((this->etms).
                                         super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->eta).values +
                               lVar4),ind);
    if (1e-07 < ABS(dVar1)) {
      if (bVar2) {
        auVar6._8_4_ = SUB84(ABS((double)local_48._0_8_),0);
        auVar6._0_8_ = ABS(dVar1);
        auVar6._12_4_ = (int)((ulong)ABS((double)local_48._0_8_) >> 0x20);
        auVar6 = divpd(_DAT_00116c60,auVar6);
        if (ABS(DAT_00116c60._8_8_ - auVar6._8_8_) <= ABS((double)DAT_00116c60 - auVar6._0_8_))
        goto LAB_00114991;
      }
      bVar2 = true;
      local_48._8_4_ = extraout_XMM0_Dc;
      local_48._0_8_ = dVar1;
      local_48._12_4_ = extraout_XMM0_Dd;
      sVar3 = sVar5;
    }
LAB_00114991:
    sVar5 = sVar5 + 1;
    lVar4 = lVar4 + 0x20;
  } while( true );
}

Assistant:

Base::Pivot Base::find_pivot(size_t ind) const {
  static const auto dist_to_one = [](double d) {
    return std::fabs(1 - 1.0 / std::fabs(d));
  };
  Pivot pivot{false, 0, 0};
  for (size_t j = ind; j < m; j++) { // Find etm with non-zero in ind
    auto val = etms[j].eta.get_value(ind);
    if (is_zero(val))
      continue;
    if (not pivot.found or (dist_to_one(val) < dist_to_one(pivot.value))) {
      pivot.found = true;
      pivot.index = j;
      pivot.value = val;
    }
  }
  return pivot;
}